

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationFactory.cpp
# Opt level: O3

bool __thiscall
OpenMD::OptimizationFactory::registerOptimization
          (OptimizationFactory *this,OptimizationCreator *creator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>,_bool>
  pVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>
  local_48;
  
  paVar1 = &local_48.first.field_2;
  pcVar2 = (creator->ident_)._M_dataplus._M_p;
  local_48.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (creator->ident_)._M_string_length);
  local_48.second = creator;
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::OptimizationCreator*>>>
                      *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p,local_48.first.field_2._M_allocated_capacity + 1
                   );
  }
  return (bool)(pVar3.second & 1);
}

Assistant:

bool OptimizationFactory::registerOptimization(OptimizationCreator* creator) {
    return creatorMap_
        .insert(CreatorMapType::value_type(creator->getIdent(), creator))
        .second;
  }